

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *S,bool ShowColors,bool ShowKindLabel)

{
  string *psVar1;
  undefined8 *puVar2;
  byte bVar3;
  pointer ppVar4;
  uint uVar5;
  StringRef LineContents;
  ArrayRef<llvm::SMRange> Ranges;
  ArrayRef<llvm::SMFixIt> FixIts;
  StringRef LineContents_00;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  raw_ostream *prVar9;
  ulong uVar10;
  size_type sVar11;
  undefined7 in_register_00000009;
  uint *__n;
  uint *puVar12;
  char *pcVar13;
  byte *pbVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar15;
  void *__buf;
  size_t sVar16;
  void *__buf_00;
  void *__buf_01;
  char *pcVar17;
  ulong uVar18;
  undefined8 extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *extraout_RDX_04;
  byte *extraout_RDX_05;
  byte *extraout_RDX_06;
  byte *extraout_RDX_07;
  byte *extraout_RDX_08;
  byte *__buf_02;
  byte *extraout_RDX_09;
  SMLoc Loc;
  SMFixIt *pSVar19;
  long lVar20;
  ulong uVar21;
  char *pcVar22;
  undefined3 in_register_00000081;
  undefined4 uVar23;
  undefined4 in_register_00000084;
  undefined1 ShowColors_00;
  undefined4 in_R9D;
  size_t i;
  SMFixIt *pSVar24;
  byte bVar25;
  ulong uVar26;
  size_t OutCol;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Chars;
  StringRef Text;
  string CaretLine;
  string FixItInsertionLine;
  SMDiagnostic SStack_250;
  raw_ostream *prStack_e8;
  char *pcStack_e0;
  ulong uStack_d8;
  byte **ppbStack_d0;
  undefined7 uStack_c0;
  byte local_b9;
  ulong local_b8;
  SMFixIt *local_b0;
  byte *local_a8;
  ulong local_a0;
  long local_98 [2];
  ulong local_88;
  char *local_80;
  undefined1 *local_78;
  SMFixIt *local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  SMDiagnostic *local_58;
  size_type local_50;
  char *local_48;
  StringRef local_40;
  
  uVar23 = CONCAT31(in_register_00000081,ShowKindLabel);
  __n = (uint *)CONCAT71(in_register_00000009,ShowColors);
  ppbStack_d0 = (byte **)0x161974;
  iVar6 = (*S->_vptr_raw_ostream[6])(S);
  bVar25 = (byte)iVar6 & ShowColors;
  uVar26 = (ulong)CONCAT31((int3)((uint)iVar6 >> 8),bVar25);
  if (bVar25 == 1) {
    __n = (uint *)0x0;
    ppbStack_d0 = (byte **)0x161995;
    (*S->_vptr_raw_ostream[2])(S,8,1);
  }
  if ((ProgName != (char *)0x0) && (*ProgName != '\0')) {
    ppbStack_d0 = (byte **)0x1619a9;
    sVar8 = strlen(ProgName);
    ppbStack_d0 = (byte **)0x1619b7;
    Str.Length = sVar8;
    Str.Data = ProgName;
    prVar9 = raw_ostream::operator<<(S,Str);
    ppbStack_d0 = (byte **)0x1619cb;
    Str_00.Length = 2;
    Str_00.Data = ": ";
    raw_ostream::operator<<(prVar9,Str_00);
  }
  if ((this->Filename)._M_string_length != 0) {
    ppbStack_d0 = (byte **)0x1619e6;
    iVar6 = std::__cxx11::string::compare((char *)&this->Filename);
    if (iVar6 == 0) {
      ppbStack_d0 = (byte **)0x161a10;
      Str_01.Length = 7;
      Str_01.Data = "<stdin>";
      raw_ostream::operator<<(S,Str_01);
      pvVar15 = extraout_RDX_00;
    }
    else {
      ppbStack_d0 = (byte **)0x1619fa;
      raw_ostream::write(S,(int)(this->Filename)._M_dataplus._M_p,
                         (void *)(this->Filename)._M_string_length,(size_t)__n);
      pvVar15 = extraout_RDX;
    }
    if (this->LineNo != -1) {
      pcVar17 = S->OutBufCur;
      if (pcVar17 < S->OutBufEnd) {
        __n = (uint *)(pcVar17 + 1);
        S->OutBufCur = (char *)__n;
        *pcVar17 = ':';
        prVar9 = S;
      }
      else {
        ppbStack_d0 = (byte **)0x161a3e;
        prVar9 = (raw_ostream *)raw_ostream::write(S,0x3a,pvVar15,(size_t)__n);
      }
      ppbStack_d0 = (byte **)0x161a4a;
      raw_ostream::operator<<(prVar9,(long)this->LineNo);
      if (this->ColumnNo != -1) {
        pcVar17 = S->OutBufCur;
        if (pcVar17 < S->OutBufEnd) {
          __n = (uint *)(pcVar17 + 1);
          S->OutBufCur = (char *)__n;
          *pcVar17 = ':';
          prVar9 = S;
        }
        else {
          ppbStack_d0 = (byte **)0x161a78;
          prVar9 = (raw_ostream *)raw_ostream::write(S,0x3a,__buf,(size_t)__n);
        }
        ppbStack_d0 = (byte **)0x161a87;
        raw_ostream::operator<<(prVar9,(long)this->ColumnNo + 1);
      }
    }
    ppbStack_d0 = (byte **)0x161a9b;
    Str_02.Length = 2;
    Str_02.Data = ": ";
    raw_ostream::operator<<(S,Str_02);
  }
  if (ShowKindLabel) {
    puVar12 = &switchD_00161ac0::switchdataD_001aa474;
    switch(this->Kind) {
    case DK_Error:
      if (bVar25 != 0) {
        puVar12 = (uint *)0x0;
        ppbStack_d0 = (byte **)0x161adc;
        (*S->_vptr_raw_ostream[2])(S,1,1);
      }
      pcVar17 = "error: ";
      sVar16 = 7;
      break;
    case DK_Warning:
      if (bVar25 != 0) {
        puVar12 = (uint *)0x0;
        ppbStack_d0 = (byte **)0x161b51;
        (*S->_vptr_raw_ostream[2])(S,5,1);
      }
      pcVar17 = "warning: ";
      sVar16 = 9;
      break;
    case DK_Remark:
      if (bVar25 != 0) {
        puVar12 = (uint *)0x0;
        ppbStack_d0 = (byte **)0x161b04;
        (*S->_vptr_raw_ostream[2])(S,4,1);
      }
      pcVar17 = "remark: ";
      sVar16 = 8;
      break;
    case DK_Note:
      if (bVar25 != 0) {
        puVar12 = (uint *)0x0;
        ppbStack_d0 = (byte **)0x161b29;
        (*S->_vptr_raw_ostream[2])(S,0,1);
      }
      pcVar17 = "note: ";
      sVar16 = 6;
      break;
    default:
      goto switchD_00161ac0_default;
    }
    ppbStack_d0 = (byte **)0x161b65;
    Str_03.Length = sVar16;
    Str_03.Data = pcVar17;
    raw_ostream::operator<<(S,Str_03);
    __n = puVar12;
switchD_00161ac0_default:
    if (bVar25 != 0) {
      ppbStack_d0 = (byte **)0x161b73;
      (*S->_vptr_raw_ostream[3])(S);
      __n = (uint *)0x0;
      ppbStack_d0 = (byte **)0x161b88;
      (*S->_vptr_raw_ostream[2])(S,8,1);
      goto LAB_00161b88;
    }
    ppbStack_d0 = (byte **)0x161bdc;
    prVar9 = (raw_ostream *)
             raw_ostream::write(S,(int)(this->Message)._M_dataplus._M_p,
                                (void *)(this->Message)._M_string_length,(size_t)__n);
    pcVar17 = prVar9->OutBufCur;
    if (pcVar17 < prVar9->OutBufEnd) {
      prVar9->OutBufCur = pcVar17 + 1;
      *pcVar17 = '\n';
    }
    else {
      ppbStack_d0 = (byte **)0x161c00;
      raw_ostream::write(prVar9,10,__buf_01,(size_t)pcVar17);
    }
  }
  else {
LAB_00161b88:
    ppbStack_d0 = (byte **)0x161b98;
    prVar9 = (raw_ostream *)
             raw_ostream::write(S,(int)(this->Message)._M_dataplus._M_p,
                                (void *)(this->Message)._M_string_length,(size_t)__n);
    pcVar17 = prVar9->OutBufCur;
    if (pcVar17 < prVar9->OutBufEnd) {
      prVar9->OutBufCur = pcVar17 + 1;
      *pcVar17 = '\n';
    }
    else {
      ppbStack_d0 = (byte **)0x161bbc;
      raw_ostream::write(prVar9,10,__buf_00,(size_t)pcVar17);
    }
    if (bVar25 != 0) {
      ppbStack_d0 = (byte **)0x161bca;
      (*S->_vptr_raw_ostream[3])(S);
    }
  }
  if (this->LineNo == -1) {
    return;
  }
  if (this->ColumnNo == -1) {
    return;
  }
  psVar1 = &this->LineContents;
  pcVar17 = (psVar1->_M_dataplus)._M_p;
  local_b8 = (this->LineContents)._M_string_length;
  LineContents_00.Data = (psVar1->_M_dataplus)._M_p;
  LineContents_00.Length = psVar1->_M_string_length;
  pcVar22 = pcVar17 + local_b8;
  pcVar13 = pcVar17;
  if (0 < (long)local_b8 >> 2) {
    pcVar13 = pcVar17 + (local_b8 & 0xfffffffffffffffc);
    lVar20 = ((long)local_b8 >> 2) + 1;
    pcVar17 = pcVar17 + 3;
    do {
      if (pcVar17[-3] < '\0') {
        pcVar17 = pcVar17 + -3;
        goto LAB_00161cae;
      }
      if (pcVar17[-2] < '\0') {
        pcVar17 = pcVar17 + -2;
        goto LAB_00161cae;
      }
      if (pcVar17[-1] < '\0') {
        pcVar17 = pcVar17 + -1;
        goto LAB_00161cae;
      }
      if (*pcVar17 < '\0') goto LAB_00161cae;
      lVar20 = lVar20 + -1;
      pcVar17 = pcVar17 + 4;
    } while (1 < lVar20);
  }
  lVar20 = (long)pcVar22 - (long)pcVar13;
  if (lVar20 == 1) {
LAB_00161c93:
    pcVar17 = pcVar13;
    if (-1 < *pcVar13) {
      pcVar17 = pcVar22;
    }
  }
  else if (lVar20 == 2) {
LAB_00161c8b:
    pcVar17 = pcVar13;
    if (-1 < *pcVar13) {
      pcVar13 = pcVar13 + 1;
      goto LAB_00161c93;
    }
  }
  else {
    if (lVar20 != 3) goto LAB_00161cd1;
    pcVar17 = pcVar13;
    if (-1 < *pcVar13) {
      pcVar13 = pcVar13 + 1;
      goto LAB_00161c8b;
    }
  }
LAB_00161cae:
  if (pcVar17 != pcVar22) {
    printSourceLine(S,LineContents_00);
    return;
  }
LAB_00161cd1:
  local_a8 = (byte *)local_98;
  ppbStack_d0 = (byte **)0x161cf7;
  local_b9 = bVar25;
  std::__cxx11::string::_M_construct((ulong)&local_a8,(char)local_b8 + '\x01');
  uVar10 = (ulong)((long)(this->Ranges).
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->Ranges).
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar10 != 0) {
    uVar26 = uVar10 & 0xffffffff;
    uVar10 = 0;
    do {
      ppVar4 = (this->Ranges).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar21 = (ulong)ppVar4[uVar10].first;
      uVar18 = (ulong)ppVar4[uVar10].second;
      if (local_a0 < uVar18) {
        uVar18 = local_a0;
      }
      sVar8 = uVar18 - uVar21;
      if (sVar8 != 0) {
        ppbStack_d0 = (byte **)0x161d43;
        memset(local_a8 + uVar21,0x7e,sVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar26 != uVar10);
  }
  ShowColors_00 = (undefined1)in_R9D;
  local_78 = &local_68;
  local_70 = (SMFixIt *)0x0;
  local_68 = 0;
  uVar10 = (ulong)(this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
                  super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                  super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  uVar7 = this->ColumnNo;
  if (uVar10 != 0) {
    local_50 = (this->LineContents)._M_string_length;
    ProgName = (this->Loc).Ptr + -(long)(int)uVar7;
    pvVar15 = (this->FixIts).super_SmallVectorImpl<llvm::SMFixIt>.
              super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
              super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
    local_80 = ProgName + local_50;
    uVar10 = uVar10 * 0x30;
    uVar26 = 0;
    local_b0 = (SMFixIt *)0x0;
    local_88 = uVar10;
    local_58 = this;
    local_48 = ProgName;
    do {
      puVar2 = (undefined8 *)((long)pvVar15 + uVar26 + 0x10);
      local_40.Data = (char *)*puVar2;
      local_40.Length = puVar2[1];
      ppbStack_d0 = (byte **)0x161de5;
      Chars.Length = 3;
      Chars.Data = "\n\r\t";
      sVar11 = StringRef::find_first_of(&local_40,Chars,0);
      if (sVar11 == 0xffffffffffffffff) {
        pcVar17 = *(char **)((long)pvVar15 + uVar26);
        pcVar22 = *(char **)((long)pvVar15 + uVar26 + 8);
        Text.Length._1_7_ = (undefined7)((ulong)extraout_RDX_01 >> 8);
        Text.Length._0_1_ = pcVar22 < ProgName || local_80 < pcVar17;
        if (pcVar22 >= ProgName && local_80 >= pcVar17) {
          uVar7 = (int)pcVar17 - (int)ProgName;
          if (pcVar17 < ProgName) {
            uVar7 = 0;
          }
          pSVar19 = (SMFixIt *)(ulong)uVar7;
          ppbStack_d0 = (byte **)0x161e2e;
          Text.Data = *(char **)((long)pvVar15 + uVar26 + 0x18);
          iVar6 = sys::locale::columnWidth(*(locale **)((long)pvVar15 + uVar26 + 0x10),Text);
          sVar8 = (size_t)iVar6;
          if (*(size_t *)((long)pvVar15 + uVar26 + 0x18) != sVar8) {
            ppbStack_d0 = (byte **)0x162150;
            __assert_fail("(size_t)sys::locale::columnWidth(I->getText()) == I->getText().size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                          ,0x141,
                          "void buildFixItLine(std::string &, std::string &, ArrayRef<SMFixIt>, ArrayRef<char>)"
                         );
          }
          uVar5 = (int)local_b0 + 1;
          if (local_b0 <= pSVar19) {
            uVar5 = uVar7;
          }
          local_b0 = (SMFixIt *)(ulong)(iVar6 + uVar5);
          if (local_70 < local_b0) {
            ppbStack_d0 = (byte **)0x161e6f;
            std::__cxx11::string::resize((ulong)&local_78,(char)(iVar6 + uVar5));
            sVar8 = *(size_t *)((long)pvVar15 + uVar26 + 0x18);
          }
          if (sVar8 != 0) {
            ppbStack_d0 = (byte **)0x161e8b;
            memmove(local_78 + uVar5,*(void **)((long)pvVar15 + uVar26 + 0x10),sVar8);
          }
          ProgName = local_48;
          uVar7 = (int)pcVar22 - (int)local_48;
          if (local_80 <= pcVar22) {
            uVar7 = (uint)local_50;
          }
          uVar10 = local_88;
          if ((ulong)uVar7 - (long)pSVar19 != 0) {
            ppbStack_d0 = (byte **)0x161ebd;
            memset((byte *)((long)&(pSVar19->Range).Start.Ptr + (long)local_a8),0x7e,
                   (ulong)uVar7 - (long)pSVar19);
            uVar10 = local_88;
          }
        }
      }
      ShowColors_00 = (undefined1)in_R9D;
      uVar26 = uVar26 + 0x30;
    } while (uVar10 != uVar26);
    uVar7 = local_58->ColumnNo;
    this = local_58;
  }
  uVar10 = (long)(int)uVar7;
  if (local_b8 < uVar7) {
    uVar10 = local_b8;
  }
  local_a8[uVar10] = 0x5e;
  ppbStack_d0 = (byte **)0x161f0f;
  lVar20 = std::__cxx11::string::find_last_not_of((char)&local_a8,0x20);
  bVar25 = local_b9;
  uVar10 = lVar20 + 1;
  if (uVar10 <= local_a0) {
    local_a8[uVar10] = 0;
    LineContents.Data = (this->LineContents)._M_dataplus._M_p;
    LineContents.Length = (this->LineContents)._M_string_length;
    ppbStack_d0 = (byte **)0x161f42;
    pbVar14 = local_a8;
    local_a0 = uVar10;
    printSourceLine(S,LineContents);
    __buf_02 = extraout_RDX_02;
    if (bVar25 != 0) {
      pbVar14 = (byte *)0x0;
      ppbStack_d0 = (byte **)0x161f5c;
      (*S->_vptr_raw_ostream[2])(S,2,1);
      __buf_02 = extraout_RDX_03;
    }
    uVar26 = local_a0 & 0xffffffff;
    if (uVar26 != 0) {
      uVar10 = 0;
      bVar25 = 0;
      do {
        if ((uVar10 < (this->LineContents)._M_string_length) &&
           ((this->LineContents)._M_dataplus._M_p[uVar10] == '\t')) {
          do {
            bVar3 = local_a8[uVar10];
            pbVar14 = (byte *)S->OutBufCur;
            if (pbVar14 < S->OutBufEnd) {
              __buf_02 = pbVar14 + 1;
              S->OutBufCur = (char *)__buf_02;
              *pbVar14 = bVar3;
            }
            else {
              ppbStack_d0 = (byte **)0x161fa6;
              raw_ostream::write(S,(uint)bVar3,__buf_02,(size_t)pbVar14);
              __buf_02 = extraout_RDX_04;
            }
            bVar25 = bVar25 + 1;
          } while ((bVar25 & 7) != 0);
        }
        else {
          bVar3 = local_a8[uVar10];
          pbVar14 = (byte *)S->OutBufCur;
          if (pbVar14 < S->OutBufEnd) {
            __buf_02 = pbVar14 + 1;
            S->OutBufCur = (char *)__buf_02;
            *pbVar14 = bVar3;
          }
          else {
            ppbStack_d0 = (byte **)0x161fda;
            raw_ostream::write(S,(uint)bVar3,__buf_02,(size_t)pbVar14);
            __buf_02 = extraout_RDX_05;
          }
          bVar25 = bVar25 + 1;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar26);
    }
    pcVar17 = S->OutBufCur;
    if (pcVar17 < S->OutBufEnd) {
      S->OutBufCur = pcVar17 + 1;
      *pcVar17 = '\n';
    }
    else {
      ppbStack_d0 = (byte **)0x162008;
      raw_ostream::write(S,10,__buf_02,(size_t)pbVar14);
      __buf_02 = extraout_RDX_06;
    }
    if (local_b9 != 0) {
      ppbStack_d0 = (byte **)0x162019;
      (*S->_vptr_raw_ostream[3])(S);
      __buf_02 = extraout_RDX_07;
    }
    pSVar19 = local_70;
    if (local_70 != (SMFixIt *)0x0) {
      uVar26 = 0;
      pSVar24 = (SMFixIt *)0x0;
      do {
        if ((pSVar24 < (SMFixIt *)(this->LineContents)._M_string_length) &&
           (*(byte *)((long)&(pSVar24->Range).Start.Ptr +
                     (long)(this->LineContents)._M_dataplus._M_p) == 9)) {
          do {
            bVar25 = local_78[(long)pSVar24];
            pbVar14 = (byte *)S->OutBufCur;
            if (pbVar14 < S->OutBufEnd) {
              __buf_02 = pbVar14 + 1;
              S->OutBufCur = (char *)__buf_02;
              *pbVar14 = bVar25;
            }
            else {
              ppbStack_d0 = (byte **)0x162068;
              raw_ostream::write(S,(uint)bVar25,__buf_02,(size_t)pbVar14);
              __buf_02 = extraout_RDX_08;
            }
            pbVar14 = (byte *)(ulong)(local_78[(long)pSVar24] != ' ');
            pSVar24 = (SMFixIt *)((long)&(pSVar24->Range).Start.Ptr + (long)pbVar14);
            uVar26 = uVar26 + 1;
          } while (((uVar26 & 7) != 0) && (pSVar24 != pSVar19));
        }
        else {
          bVar25 = local_78[(long)pSVar24];
          pbVar14 = (byte *)S->OutBufCur;
          if (pbVar14 < S->OutBufEnd) {
            __buf_02 = pbVar14 + 1;
            S->OutBufCur = (char *)__buf_02;
            *pbVar14 = bVar25;
          }
          else {
            ppbStack_d0 = (byte **)0x1620b4;
            raw_ostream::write(S,(uint)bVar25,__buf_02,(size_t)pbVar14);
            __buf_02 = extraout_RDX_09;
          }
          uVar26 = uVar26 + 1;
        }
        pSVar24 = (SMFixIt *)((long)&(pSVar24->Range).Start.Ptr + 1);
      } while (pSVar24 < pSVar19);
      pcVar17 = S->OutBufCur;
      if (pcVar17 < S->OutBufEnd) {
        S->OutBufCur = pcVar17 + 1;
        *pcVar17 = '\n';
      }
      else {
        ppbStack_d0 = (byte **)0x1620e7;
        raw_ostream::write(S,10,__buf_02,(size_t)pbVar14);
      }
    }
    if (local_78 != &local_68) {
      ppbStack_d0 = (byte **)0x162103;
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    if (local_a8 != (byte *)local_98) {
      ppbStack_d0 = (byte **)0x16211f;
      operator_delete(local_a8,local_98[0] + 1);
    }
    return;
  }
  pcVar22 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
  pcVar17 = "basic_string::erase";
  ppbStack_d0 = (byte **)SourceMgr::PrintMessage;
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar10);
  Ranges.Data._7_1_ = local_b9;
  Ranges.Data._0_7_ = uStack_c0;
  Ranges.Length = local_b8;
  FixIts.Length = (size_type)local_a8;
  FixIts.Data = local_b0;
  prStack_e8 = S;
  pcStack_e0 = ProgName;
  uStack_d8 = uVar26;
  ppbStack_d0 = &local_a8;
  SourceMgr::GetMessage
            (&SStack_250,(SourceMgr *)pcVar22,Loc,(DiagKind)local_a0,
             (Twine *)CONCAT44(in_register_00000084,uVar23),Ranges,FixIts);
  SourceMgr::PrintMessage
            ((SourceMgr *)pcVar22,(raw_ostream *)pcVar17,&SStack_250,(bool)ShowColors_00);
  SmallVector<llvm::SMFixIt,_4U>::~SmallVector(&SStack_250.FixIts);
  if (SStack_250.Ranges.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(SStack_250.Ranges.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)SStack_250.Ranges.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)SStack_250.Ranges.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_250.LineContents._M_dataplus._M_p != &SStack_250.LineContents.field_2) {
    operator_delete(SStack_250.LineContents._M_dataplus._M_p,
                    SStack_250.LineContents.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_250.Message._M_dataplus._M_p != &SStack_250.Message.field_2) {
    operator_delete(SStack_250.Message._M_dataplus._M_p,
                    SStack_250.Message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_250.Filename._M_dataplus._M_p != &SStack_250.Filename.field_2) {
    operator_delete(SStack_250.Filename._M_dataplus._M_p,
                    SStack_250.Filename.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &S, bool ShowColors,
                         bool ShowKindLabel) const {
  // Display colors only if OS supports colors.
  ShowColors &= S.has_colors();

  if (ShowColors)
    S.changeColor(raw_ostream::SAVEDCOLOR, true);

  if (ProgName && ProgName[0])
    S << ProgName << ": ";

  if (!Filename.empty()) {
    if (Filename == "-")
      S << "<stdin>";
    else
      S << Filename;

    if (LineNo != -1) {
      S << ':' << LineNo;
      if (ColumnNo != -1)
        S << ':' << (ColumnNo+1);
    }
    S << ": ";
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      if (ShowColors)
        S.changeColor(raw_ostream::RED, true);
      S << "error: ";
      break;
    case SourceMgr::DK_Warning:
      if (ShowColors)
        S.changeColor(raw_ostream::MAGENTA, true);
      S << "warning: ";
      break;
    case SourceMgr::DK_Note:
      if (ShowColors)
        S.changeColor(raw_ostream::BLACK, true);
      S << "note: ";
      break;
    case SourceMgr::DK_Remark:
      if (ShowColors)
        S.changeColor(raw_ostream::BLUE, true);
      S << "remark: ";
      break;
    }

    if (ShowColors) {
      S.resetColor();
      S.changeColor(raw_ostream::SAVEDCOLOR, true);
    }
  }

  S << Message << '\n';

  if (ShowColors)
    S.resetColor();

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(S, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(S, LineContents);

  if (ShowColors)
    S.changeColor(raw_ostream::GREEN, true);

  // Print out the caret line, matching tabs in the source line.
  for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << CaretLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << CaretLine[i];
      ++OutCol;
    } while ((OutCol % TabStop) != 0);
  }
  S << '\n';

  if (ShowColors)
    S.resetColor();

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      S << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      S << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  S << '\n';
}